

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O2

void __thiscall
Assimp::ColladaParser::ColladaParser(ColladaParser *this,IOSystem *pIOHandler,string *pFile)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  ColladaParser *this_00;
  IOStream *_stream;
  undefined4 extraout_var;
  CIrrXML_IOStreamReader *this_01;
  IrrXMLReader *pIVar5;
  DeadlyImportError *pDVar6;
  ZipArchiveIOSystem *zip_archive;
  allocator<char> local_152;
  allocator<char> local_151;
  string dae_filename;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130 [3];
  string extension;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::string((string *)this,(string *)pFile);
  p_Var1 = &(this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  this->mReader = (IrrXMLReader *)0x0;
  *(undefined8 *)&(this->mDataLibrary)._M_t._M_impl = 0;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mDataLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mAccessorLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mAccessorLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mMeshLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mMeshLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mNodeLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mNodeLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mImageLibrary)._M_t._M_impl = 0;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mImageLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mEffectLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mEffectLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mMaterialLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header
  ;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  p_Var1 = &(this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mMaterialLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mLightLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mLightLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mCameraLibrary)._M_t._M_impl = 0;
  *(undefined8 *)&(this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  p_Var1 = &(this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  (this->mCameraLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  *(undefined8 *)&(this->mControllerLibrary)._M_t._M_impl = 0;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  this->mRootNode = (Node *)0x0;
  (this->mAnims).mName._M_dataplus._M_p = (pointer)0x0;
  (this->mAnims).mName._M_string_length = 0;
  (this->mAnims).mName.field_2._M_allocated_capacity = 0;
  (this->mAnimationLibrary)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->mAnimationClipLibrary).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined8 *)((long)&(this->mAnims).mName.field_2 + 8) = 0;
  (this->mAnimationClipLibrary).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnimationClipLibrary).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnims).mName._M_dataplus._M_p = (pointer)&(this->mAnims).mName.field_2;
  (this->mAnims).mName.field_2._M_local_buf[0] = '\0';
  (this->mAnims).mChannels.
  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnims).mChannels.
  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnims).mChannels.
  super__Vector_base<Assimp::Collada::AnimationChannel,_std::allocator<Assimp::Collada::AnimationChannel>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mAnims).mSubAnims.
  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mAnims).mSubAnims.
  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->mAnims).mSubAnims.
  super__Vector_base<Assimp::Collada::Animation_*,_std::allocator<Assimp::Collada::Animation_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->mUnitSize = 1.0;
  this->mUpDirection = UP_Y;
  p_Var1 = &(this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->mAssetMetaData)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->mFormat = FV_1_5_n;
  if (pIOHandler == (IOSystem *)0x0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&extension,"IOSystem is NULL.",(allocator<char> *)&dae_filename);
    DeadlyImportError::DeadlyImportError(pDVar6,&extension);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  BaseImporter::GetExtension(&extension,pFile);
  bVar2 = std::operator!=(&extension,"dae");
  if (bVar2) {
    this_00 = (ColladaParser *)Intern::AllocateFromAssimpHeap::operator_new(0x28);
    ZipArchiveIOSystem::ZipArchiveIOSystem((ZipArchiveIOSystem *)this_00,pIOHandler,pFile,"r");
    bVar3 = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)this_00);
    if (bVar3) {
      ReadZaeManifest_abi_cxx11_(&dae_filename,this_00,zip_archive);
      if (dae_filename._M_string_length == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_130,"Invalid ZAE",(allocator<char> *)&local_b0);
        ThrowException(this,local_130);
      }
      _stream = (IOStream *)
                (**(code **)((this_00->mFileName)._M_dataplus._M_p + 0x20))
                          (this_00,dae_filename._M_dataplus._M_p,"rb");
      if (_stream == (IOStream *)0x0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"Invalid ZAE manifest: \'",&local_151);
        std::__cxx11::string::string((string *)&local_70,(string *)&dae_filename);
        std::operator+(&local_b0,&local_50,&local_70);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_90,"\' is missing",&local_152);
        std::operator+(local_130,&local_b0,&local_90);
        ThrowException(this,local_130);
      }
      std::__cxx11::string::~string((string *)&dae_filename);
      goto LAB_003ea0a6;
    }
  }
  else {
    this_00 = (ColladaParser *)0x0;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dae_filename,"rb",(allocator<char> *)local_130);
  iVar4 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,dae_filename._M_dataplus._M_p);
  _stream = (IOStream *)CONCAT44(extraout_var,iVar4);
  std::__cxx11::string::~string((string *)&dae_filename);
  if (_stream == (IOStream *)0x0) {
    pDVar6 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(local_130,"Failed to open file \'",pFile);
    std::operator+(&dae_filename,local_130,"\'.");
    DeadlyImportError::DeadlyImportError(pDVar6,&dae_filename);
    __cxa_throw(pDVar6,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
LAB_003ea0a6:
  this_01 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_01,_stream);
  pIVar5 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_01);
  this->mReader = pIVar5;
  if (pIVar5 != (IrrXMLReader *)0x0) {
    ReadContents(this);
    if (bVar2) {
      bVar2 = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)this_00);
      if (bVar2) {
        ReadEmbeddedTextures(this,(ZipArchiveIOSystem *)this_00);
      }
    }
    (*(this_01->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_01);
    std::__cxx11::string::~string((string *)&extension);
    if (this_00 != (ColladaParser *)0x0) {
      (**(code **)((this_00->mFileName)._M_dataplus._M_p + 8))(this_00);
    }
    (*_stream->_vptr_IOStream[1])(_stream);
    return;
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&dae_filename,"Unable to read file, malformed XML",
             (allocator<char> *)local_130);
  ThrowException(this,&dae_filename);
}

Assistant:

ColladaParser::ColladaParser(IOSystem* pIOHandler, const std::string& pFile)
    : mFileName(pFile)
    , mReader(nullptr)
    , mDataLibrary()
    , mAccessorLibrary()
    , mMeshLibrary()
    , mNodeLibrary()
    , mImageLibrary()
    , mEffectLibrary()
    , mMaterialLibrary()
    , mLightLibrary()
    , mCameraLibrary()
    , mControllerLibrary()
    , mRootNode(nullptr)
    , mAnims()
    , mUnitSize(1.0f)
    , mUpDirection(UP_Y)
    , mFormat(FV_1_5_n)    // We assume the newest file format by default
{
    // validate io-handler instance
    if (nullptr == pIOHandler) {
        throw DeadlyImportError("IOSystem is NULL.");
    }

    std::unique_ptr<IOStream> daefile;
    std::unique_ptr<ZipArchiveIOSystem> zip_archive;

    // Determine type
    std::string extension = BaseImporter::GetExtension(pFile);
    if (extension != "dae") {
        zip_archive.reset(new ZipArchiveIOSystem(pIOHandler, pFile));
    }

    if (zip_archive && zip_archive->isOpen()) {
        std::string dae_filename = ReadZaeManifest(*zip_archive);

        if (dae_filename.empty()) {
            ThrowException(std::string("Invalid ZAE"));
        }

        daefile.reset(zip_archive->Open(dae_filename.c_str()));
        if (daefile == nullptr) {
            ThrowException(std::string("Invalid ZAE manifest: '") + std::string(dae_filename) + std::string("' is missing"));
        }
    }
    else {
        // attempt to open the file directly
        daefile.reset(pIOHandler->Open(pFile));
        if (daefile.get() == nullptr) {
            throw DeadlyImportError("Failed to open file '" + pFile + "'.");
        }
    }

    // generate a XML reader for it
    std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(daefile.get()));
    mReader = irr::io::createIrrXMLReader(mIOWrapper.get());
    if (!mReader) {
        ThrowException("Unable to read file, malformed XML");
    }

    // start reading
    ReadContents();

    // read embedded textures
    if (zip_archive && zip_archive->isOpen()) {
        ReadEmbeddedTextures(*zip_archive);
    }
}